

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

void __thiscall AActor::VelFromAngle(AActor *this,double speed,DAngle *angle)

{
  double dVar1;
  DAngle *angle_local;
  double speed_local;
  AActor *this_local;
  
  dVar1 = TAngle<double>::Cos(angle);
  (this->Vel).X = speed * dVar1;
  dVar1 = TAngle<double>::Sin(angle);
  (this->Vel).Y = speed * dVar1;
  return;
}

Assistant:

void VelFromAngle(double speed, DAngle angle)
	{
		Vel.X = speed * angle.Cos();
		Vel.Y = speed * angle.Sin();
	}